

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsystemtraytracker.cpp
# Opt level: O3

QXcbSystemTrayTracker * QXcbSystemTrayTracker::create(QXcbConnection *connection)

{
  xcb_atom_t xVar1;
  xcb_atom_t xVar2;
  QXcbSystemTrayTracker *this;
  char *name;
  long in_FS_OFFSET;
  QArrayData *local_a8;
  char *pcStack_a0;
  qsizetype local_98;
  QStringBuilder<QByteArray,_QByteArray> local_88;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  xVar1 = (connection->super_QXcbBasicConnection).m_xcbAtom.m_allAtoms[8];
  if (xVar1 == 0) {
    this = (QXcbSystemTrayTracker *)0x0;
  }
  else {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::number((int)&local_a8,(connection->super_QXcbBasicConnection).m_primaryScreenNumber)
    ;
    local_88.b.d.size = local_98;
    local_88.b.d.ptr = pcStack_a0;
    local_88.b.d.d = (Data *)local_a8;
    local_88.a.d.d = (Data *)0x0;
    local_88.a.d.ptr = "_NET_SYSTEM_TRAY_S";
    local_88.a.d.size = 0x12;
    local_a8 = (QArrayData *)0x0;
    pcStack_a0 = (char *)0x0;
    local_98 = 0;
    QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>(&local_58,&local_88);
    QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder(&local_88);
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,1,0x10);
      }
    }
    name = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      name = (char *)&QByteArray::_empty;
    }
    xVar2 = QXcbBasicConnection::internAtom((QXcbBasicConnection *)connection,name);
    if (xVar2 == 0) {
      this = (QXcbSystemTrayTracker *)0x0;
    }
    else {
      this = (QXcbSystemTrayTracker *)operator_new(0x30);
      QObject::QObject((QObject *)this,(QObject *)connection);
      *(undefined ***)this = &PTR_metaObject_001b4118;
      (this->super_QXcbWindowEventListener)._vptr_QXcbWindowEventListener =
           (_func_int **)&PTR__QXcbSystemTrayTracker_001b4190;
      this->m_selection = xVar2;
      this->m_trayAtom = xVar1;
      this->m_connection = connection;
      this->m_trayWindow = 0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QXcbSystemTrayTracker *QXcbSystemTrayTracker::create(QXcbConnection *connection)
{
    // Selection, tray atoms for GNOME, NET WM Specification
    const xcb_atom_t trayAtom = connection->atom(QXcbAtom::Atom_NET_SYSTEM_TRAY_OPCODE);
    if (!trayAtom)
        return nullptr;
    const QByteArray netSysTray = QByteArrayLiteral("_NET_SYSTEM_TRAY_S") + QByteArray::number(connection->primaryScreenNumber());
    const xcb_atom_t selection = connection->internAtom(netSysTray.constData());
    if (!selection)
        return nullptr;

    return new QXcbSystemTrayTracker(connection, trayAtom, selection);
}